

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::print_const_value
          (t_cpp_generator *this,ostream *out,string *name,t_type *type,t_const_value *value)

{
  __type _Var1;
  bool bVar2;
  uint uVar3;
  e_req eVar4;
  int iVar5;
  t_struct *this_00;
  int64_t iVar6;
  reference pptVar7;
  string *__lhs;
  undefined4 extraout_var;
  t_type *type_00;
  pointer ppVar8;
  t_type *ptVar9;
  reference pptVar10;
  ostream *poVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  undefined4 extraout_var_00;
  string local_378;
  undefined1 local_358 [8];
  string val_7;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_328;
  const_iterator v_iter_3;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_6;
  t_type *etype_1;
  undefined1 local_2f0 [8];
  string val_5;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_2c0;
  const_iterator v_iter_2;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_4;
  t_type *etype;
  undefined1 local_288 [8];
  string val_3;
  undefined1 local_248 [8];
  string key;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_218;
  const_iterator v_iter_1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_2;
  t_type *vtype;
  t_type *ktype;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [8];
  string val_1;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_f0;
  t_field **local_e8;
  t_type *local_e0;
  t_type *field_type;
  _Base_ptr local_d0;
  byte local_c1;
  const_iterator cStack_c0;
  bool is_nonrequired_field;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_70;
  undefined1 local_50 [8];
  string v2;
  t_const_value *value_local;
  t_type *type_local;
  string *name_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  v2.field_2._8_8_ = value;
  this_00 = (t_struct *)t_generator::get_true_type(type);
  uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar3 & 1) == 0) {
    uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar3 & 1) == 0) {
      uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xb])();
      if (((uVar3 & 1) == 0) &&
         (uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
        uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0x10])();
        if ((uVar3 & 1) == 0) {
          uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xe])();
          if ((uVar3 & 1) == 0) {
            uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])();
            if ((uVar3 & 1) == 0) {
              pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar5 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
              std::operator+(pbVar12,"INVALID TYPE IN print_const_value: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar5));
              __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            ptVar9 = t_set::get_elem_type((t_set *)this_00);
            v_iter_3._M_current =
                 (t_const_value **)t_const_value::get_list((t_const_value *)v2.field_2._8_8_);
            __gnu_cxx::
            __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
            ::__normal_iterator(&local_328);
            local_328._M_current =
                 (t_const_value **)
                 std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                           (v_iter_3._M_current);
            while( true ) {
              val_7.field_2._8_8_ =
                   std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                             ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                              v_iter_3._M_current);
              bVar2 = __gnu_cxx::operator!=
                                (&local_328,
                                 (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                  *)((long)&val_7.field_2 + 8));
              if (!bVar2) break;
              std::__cxx11::string::string((string *)&local_378,(string *)name);
              pptVar10 = __gnu_cxx::
                         __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                         ::operator*(&local_328);
              render_const_value((string *)local_358,this,out,&local_378,ptVar9,*pptVar10);
              std::__cxx11::string::~string((string *)&local_378);
              poVar11 = t_generator::indent((t_generator *)this,out);
              poVar11 = std::operator<<(poVar11,(string *)name);
              poVar11 = std::operator<<(poVar11,".insert(");
              poVar11 = std::operator<<(poVar11,(string *)local_358);
              poVar11 = std::operator<<(poVar11,");");
              std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)local_358);
              __gnu_cxx::
              __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
              ::operator++(&local_328);
            }
            std::operator<<(out,(string *)&::endl_abi_cxx11_);
          }
          else {
            ptVar9 = t_list::get_elem_type((t_list *)this_00);
            v_iter_2._M_current =
                 (t_const_value **)t_const_value::get_list((t_const_value *)v2.field_2._8_8_);
            __gnu_cxx::
            __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
            ::__normal_iterator(&local_2c0);
            local_2c0._M_current =
                 (t_const_value **)
                 std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                           (v_iter_2._M_current);
            while( true ) {
              val_5.field_2._8_8_ =
                   std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                             ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                              v_iter_2._M_current);
              bVar2 = __gnu_cxx::operator!=
                                (&local_2c0,
                                 (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                  *)((long)&val_5.field_2 + 8));
              if (!bVar2) break;
              std::__cxx11::string::string((string *)&etype_1,(string *)name);
              pptVar10 = __gnu_cxx::
                         __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                         ::operator*(&local_2c0);
              render_const_value((string *)local_2f0,this,out,(string *)&etype_1,ptVar9,*pptVar10);
              std::__cxx11::string::~string((string *)&etype_1);
              poVar11 = t_generator::indent((t_generator *)this,out);
              poVar11 = std::operator<<(poVar11,(string *)name);
              poVar11 = std::operator<<(poVar11,".push_back(");
              poVar11 = std::operator<<(poVar11,(string *)local_2f0);
              poVar11 = std::operator<<(poVar11,");");
              std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)local_2f0);
              __gnu_cxx::
              __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
              ::operator++(&local_2c0);
            }
            std::operator<<(out,(string *)&::endl_abi_cxx11_);
          }
        }
        else {
          ptVar9 = t_map::get_key_type((t_map *)this_00);
          type_00 = t_map::get_val_type((t_map *)this_00);
          v_iter_1._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)v2.field_2._8_8_);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_218);
          local_218._M_node =
               (_Base_ptr)
               std::
               map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               ::begin(v_iter_1._M_node);
          while( true ) {
            key.field_2._8_8_ =
                 std::
                 map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        *)v_iter_1._M_node);
            bVar2 = std::operator!=(&local_218,(_Self *)((long)&key.field_2 + 8));
            if (!bVar2) break;
            std::__cxx11::string::string((string *)(val_3.field_2._M_local_buf + 8),(string *)name);
            ppVar8 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_218);
            render_const_value((string *)local_248,this,out,
                               (string *)(val_3.field_2._M_local_buf + 8),ptVar9,ppVar8->first);
            std::__cxx11::string::~string((string *)(val_3.field_2._M_local_buf + 8));
            std::__cxx11::string::string((string *)&etype,(string *)name);
            ppVar8 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_218);
            render_const_value((string *)local_288,this,out,(string *)&etype,type_00,ppVar8->second)
            ;
            std::__cxx11::string::~string((string *)&etype);
            poVar11 = t_generator::indent((t_generator *)this,out);
            poVar11 = std::operator<<(poVar11,(string *)name);
            poVar11 = std::operator<<(poVar11,".insert(std::make_pair(");
            poVar11 = std::operator<<(poVar11,(string *)local_248);
            poVar11 = std::operator<<(poVar11,", ");
            poVar11 = std::operator<<(poVar11,(string *)local_288);
            poVar11 = std::operator<<(poVar11,"));");
            std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_288);
            std::__cxx11::string::~string((string *)local_248);
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_218);
          }
          std::operator<<(out,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        f_iter._M_current = (t_field **)t_struct::get_members(this_00);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&val);
        v_iter._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)v2.field_2._8_8_);
        std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
        _Rb_tree_const_iterator(&stack0xffffffffffffff40);
        local_c1 = 0;
        local_d0 = (_Base_ptr)
                   std::
                   map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                   ::begin(v_iter._M_node);
        cStack_c0 = (const_iterator)local_d0;
        while( true ) {
          field_type = (t_type *)
                       std::
                       map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                       ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                              *)v_iter._M_node);
          bVar2 = std::operator!=(&stack0xffffffffffffff40,(_Self *)&field_type);
          if (!bVar2) break;
          local_e0 = (t_type *)0x0;
          local_c1 = 0;
          local_e8 = (t_field **)
                     std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
          val = (map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 *)local_e8;
          while( true ) {
            local_f0._M_current =
                 (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&val,&local_f0);
            if (!bVar2) break;
            pptVar7 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                   *)&val);
            __lhs = t_field::get_name_abi_cxx11_(*pptVar7);
            ppVar8 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&stack0xffffffffffffff40);
            t_const_value::get_string_abi_cxx11_(&local_110,ppVar8->first);
            _Var1 = std::operator==(__lhs,&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            if (_Var1) {
              pptVar7 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&val);
              local_e0 = t_field::get_type(*pptVar7);
              pptVar7 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&val);
              eVar4 = t_field::get_req(*pptVar7);
              local_c1 = eVar4 != T_REQUIRED;
            }
            __gnu_cxx::
            __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
            ::operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&val);
          }
          if (local_e0 == (t_type *)0x0) {
            val_1.field_2._M_local_buf[0xf] = '\x01';
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar5 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
            std::operator+(&local_150,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var,iVar5));
            std::operator+(&local_130,&local_150," has no field ");
            ppVar8 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&stack0xffffffffffffff40);
            t_const_value::get_string_abi_cxx11_(&local_170,ppVar8->first);
            std::operator+(pbVar12,&local_130,&local_170);
            val_1.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::__cxx11::string::string((string *)&local_1b8,(string *)name);
          ptVar9 = local_e0;
          ppVar8 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                   operator->(&stack0xffffffffffffff40);
          render_const_value((string *)local_198,this,out,&local_1b8,ptVar9,ppVar8->second);
          std::__cxx11::string::~string((string *)&local_1b8);
          poVar11 = t_generator::indent((t_generator *)this,out);
          poVar11 = std::operator<<(poVar11,(string *)name);
          poVar11 = std::operator<<(poVar11,".");
          ppVar8 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                   operator->(&stack0xffffffffffffff40);
          t_const_value::get_string_abi_cxx11_(&local_1d8,ppVar8->first);
          poVar11 = std::operator<<(poVar11,(string *)&local_1d8);
          poVar11 = std::operator<<(poVar11," = ");
          poVar11 = std::operator<<(poVar11,(string *)local_198);
          poVar11 = std::operator<<(poVar11,";");
          std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1d8);
          if ((local_c1 & 1) != 0) {
            poVar11 = t_generator::indent((t_generator *)this,out);
            poVar11 = std::operator<<(poVar11,(string *)name);
            poVar11 = std::operator<<(poVar11,".__isset.");
            ppVar8 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&stack0xffffffffffffff40);
            t_const_value::get_string_abi_cxx11_((string *)&ktype,ppVar8->first);
            poVar11 = std::operator<<(poVar11,(string *)&ktype);
            poVar11 = std::operator<<(poVar11," = true;");
            std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&ktype);
          }
          std::__cxx11::string::~string((string *)local_198);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          operator++(&stack0xffffffffffffff40);
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar11 = t_generator::indent((t_generator *)this,out);
      poVar11 = std::operator<<(poVar11,(string *)name);
      poVar11 = std::operator<<(poVar11," = (");
      type_name_abi_cxx11_((string *)&fields,this,(t_type *)this_00,false,false);
      poVar11 = std::operator<<(poVar11,(string *)&fields);
      poVar11 = std::operator<<(poVar11,")");
      iVar6 = t_const_value::get_integer((t_const_value *)v2.field_2._8_8_);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar6);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&fields);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)name);
    render_const_value((string *)local_50,this,out,&local_70,(t_type *)this_00,
                       (t_const_value *)v2.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_70);
    poVar11 = t_generator::indent((t_generator *)this,out);
    poVar11 = std::operator<<(poVar11,(string *)name);
    poVar11 = std::operator<<(poVar11," = ");
    poVar11 = std::operator<<(poVar11,(string *)local_50);
    poVar11 = std::operator<<(poVar11,";");
    poVar11 = std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void t_cpp_generator::print_const_value(ostream& out,
                                        string name,
                                        t_type* type,
                                        t_const_value* value) {
  type = get_true_type(type);
  if (type->is_base_type()) {
    string v2 = render_const_value(out, name, type, value);
    indent(out) << name << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    indent(out) << name << " = (" << type_name(type) << ")" << value->get_integer() << ";" << endl
                << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    bool is_nonrequired_field = false;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      is_nonrequired_field = false;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
          is_nonrequired_field = (*f_iter)->get_req() != t_field::T_REQUIRED;
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, name, field_type, v_iter->second);
      indent(out) << name << "." << v_iter->first->get_string() << " = " << val << ";" << endl;
      if (is_nonrequired_field) {
        indent(out) << name << ".__isset." << v_iter->first->get_string() << " = true;" << endl;
      }
    }
    out << endl;
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, name, ktype, v_iter->first);
      string val = render_const_value(out, name, vtype, v_iter->second);
      indent(out) << name << ".insert(std::make_pair(" << key << ", " << val << "));" << endl;
    }
    out << endl;
  } else if (type->is_list()) {
    t_type* etype = ((t_list*)type)->get_elem_type();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << name << ".push_back(" << val << ");" << endl;
    }
    out << endl;
  } else if (type->is_set()) {
    t_type* etype = ((t_set*)type)->get_elem_type();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << name << ".insert(" << val << ");" << endl;
    }
    out << endl;
  } else {
    throw "INVALID TYPE IN print_const_value: " + type->get_name();
  }
}